

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_context.h
# Opt level: O2

bool __thiscall Clasp::ShortImplicationsGraph::ImplicationList::empty(ImplicationList *this)

{
  bool bVar1;
  
  bVar1 = false;
  if (((this->super_ImpListBase).super_type.
       super_left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_>.left_ == 0)
     && (bVar1 = false,
        (this->super_ImpListBase).super_type.
        super_left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_>.right_ ==
        (*(uint *)&(this->super_ImpListBase).super_type.
                   super_left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_>.
                   field_0x8 & 0x7fffffff))) {
    bVar1 = (this->learnt)._M_b._M_p == (__pointer_type)0x0;
  }
  return bVar1;
}

Assistant:

bool empty() const { return ImpListBase::empty() && learnt == static_cast<Block*>(0); }